

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_4::PtexUtils::reduce
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  byte *pbVar1;
  ushort *puVar2;
  ushort *puVar3;
  float *pfVar4;
  float *pfVar5;
  uint16_t uVar6;
  byte *pbVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  
  switch(dt) {
  case dt_uint8:
    if (vw * sstride != 0) {
      pbVar7 = (byte *)((long)(vw * sstride) + (long)src);
      iVar11 = uw * nchan;
      lVar9 = (long)nchan;
      do {
        if (iVar11 != 0) {
          pbVar1 = (byte *)((long)src + (long)iVar11);
          do {
            lVar12 = lVar9;
            if (nchan != 0) {
              do {
                *(char *)dst = (char)((uint)*(byte *)((long)src + (long)(sstride + nchan)) +
                                      (uint)*(byte *)((long)src + (long)sstride) +
                                      (uint)*(byte *)((long)src + lVar9) + (uint)*src >> 2);
                dst = (void *)((long)dst + 1);
                src = (void *)((long)src + 1);
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
            src = (void *)((long)src + lVar9);
          } while ((byte *)src != pbVar1);
        }
        dst = (void *)((long)dst + (long)(dstride - iVar11 / 2));
        src = (void *)((long)src + (long)(sstride * 2 - iVar11));
      } while ((byte *)src != pbVar7);
    }
    break;
  case dt_uint16:
    iVar11 = sstride / 2;
    if (vw * iVar11 != 0) {
      puVar2 = (ushort *)((long)src + (long)(vw * iVar11) * 2);
      iVar10 = uw * nchan;
      lVar9 = (long)nchan;
      do {
        if (iVar10 != 0) {
          puVar3 = (ushort *)((long)src + (long)iVar10 * 2);
          do {
            lVar12 = lVar9 * 2;
            if (nchan != 0) {
              do {
                *(short *)dst =
                     (short)((uint)*(ushort *)((long)src + (long)(iVar11 + nchan) * 2) +
                             (uint)*(ushort *)((long)src + (long)iVar11 * 2) +
                             (uint)*(ushort *)((long)src + lVar9 * 2) + (uint)*src >> 2);
                dst = (void *)((long)dst + 2);
                src = (void *)((long)src + 2);
                lVar12 = lVar12 + -2;
              } while (lVar12 != 0);
            }
            src = (void *)((long)src + lVar9 * 2);
          } while ((ushort *)src != puVar3);
        }
        src = (void *)((long)src + (long)(iVar11 * 2 - iVar10) * 2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar10 / 2) * 2);
      } while ((ushort *)src != puVar2);
    }
    break;
  case dt_half:
    iVar11 = sstride / 2;
    if (vw * iVar11 != 0) {
      puVar2 = (ushort *)((long)src + (long)(vw * iVar11) * 2);
      iVar10 = uw * nchan;
      lVar9 = (long)nchan;
      do {
        if (iVar10 != 0) {
          puVar3 = (ushort *)((long)src + (long)iVar10 * 2);
          do {
            lVar12 = lVar9 * 2;
            if (nchan != 0) {
              do {
                uVar6 = PtexHalf::fromFloat((*(float *)(PtexHalf::h2fTable + (ulong)*src * 4) +
                                             *(float *)(PtexHalf::h2fTable +
                                                       (ulong)*(ushort *)((long)src + lVar9 * 2) * 4
                                                       ) +
                                             *(float *)(PtexHalf::h2fTable +
                                                       (ulong)*(ushort *)
                                                               ((long)src + (long)iVar11 * 2) * 4) +
                                            *(float *)(PtexHalf::h2fTable +
                                                      (ulong)*(ushort *)
                                                              ((long)src +
                                                              (long)(iVar11 + nchan) * 2) * 4)) *
                                            0.25);
                *(uint16_t *)dst = uVar6;
                dst = (void *)((long)dst + 2);
                src = (void *)((long)src + 2);
                lVar12 = lVar12 + -2;
              } while (lVar12 != 0);
            }
            src = (void *)((long)src + lVar9 * 2);
          } while ((ushort *)src != puVar3);
        }
        src = (void *)((long)src + (long)(iVar11 * 2 - iVar10) * 2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar10 / 2) * 2);
      } while ((ushort *)src != puVar2);
    }
    break;
  case dt_float:
    iVar11 = sstride + 3;
    if (-1 < sstride) {
      iVar11 = sstride;
    }
    iVar11 = iVar11 >> 2;
    if (vw * iVar11 != 0) {
      pfVar4 = (float *)((long)src + (long)(vw * iVar11) * 4);
      iVar8 = uw * nchan;
      iVar10 = dstride + 3;
      if (-1 < dstride) {
        iVar10 = dstride;
      }
      lVar9 = (long)nchan;
      do {
        if (iVar8 != 0) {
          pfVar5 = (float *)((long)src + (long)iVar8 * 4);
          do {
            lVar12 = lVar9 * 4;
            if (nchan != 0) {
              do {
                *(float *)dst =
                     (*src + *(float *)((long)src + lVar9 * 4) +
                      *(float *)((long)src + (long)iVar11 * 4) +
                     *(float *)((long)src + (long)(iVar11 + nchan) * 4)) * 0.25;
                dst = (void *)((long)dst + 4);
                src = (void *)((long)src + 4);
                lVar12 = lVar12 + -4;
              } while (lVar12 != 0);
            }
            src = (void *)((long)src + lVar9 * 4);
          } while ((float *)src != pfVar5);
        }
        src = (void *)((long)src + (long)(iVar11 * 2 - iVar8) * 4);
        dst = (void *)((long)dst + (long)((iVar10 >> 2) - iVar8 / 2) * 4);
      } while ((float *)src != pfVar4);
    }
  }
  return;
}

Assistant:

void reduce(const void* src, int sstride, int uw, int vw,
            void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reduce(static_cast<const uint8_t*>(src), sstride, uw, vw,
                              static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reduce(static_cast<const PtexHalf*>(src), sstride, uw, vw,
                              static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reduce(static_cast<const uint16_t*>(src), sstride, uw, vw,
                              static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reduce(static_cast<const float*>(src), sstride, uw, vw,
                              static_cast<float*>(dst), dstride, nchan); break;
    }
}